

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bank.cpp
# Opt level: O0

int __thiscall Bank::getRate(Bank *this,string *src,string *dst)

{
  __type _Var1;
  bool bVar2;
  runtime_error *this_00;
  string *dst_local;
  string *src_local;
  Bank *this_local;
  
  _Var1 = std::operator==(src,dst);
  if (_Var1) {
    return 1;
  }
  bVar2 = std::operator!=(src,&this->source);
  if ((!bVar2) && (bVar2 = std::operator!=(dst,&this->to), !bVar2)) {
    return this->rate;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Unknown rate");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int Bank::getRate(const string &src, const string &dst) const
{
	if (src == dst) {
		return 1;
	}
	if (src != source || dst != to) {
		throw runtime_error("Unknown rate");
	}
	return rate;
}